

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
testing::internal::ComparisonBase::operator_cast_to_Matcher
          (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ComparisonBase *this)

{
  MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar1;
  MatcherInterfaceAdapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  
  pMVar1 = (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x28);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Impl_00144cf8;
  pMVar1[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)(pMVar1 + 3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pMVar1 + 1),*(long *)this,*(long *)(this + 8) + *(long *)this);
  (__return_storage_ptr__->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00144998;
  __p = (MatcherInterfaceAdapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)operator_new(0x10);
  (__p->
  super_MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherInterfaceAdapter_00144c58;
  __p->impl_ = pMVar1;
  (__return_storage_ptr__->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::internal::MatcherInterfaceAdapter<std::__cxx11::string>*>
            (&(__return_storage_ptr__->
              super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  (__return_storage_ptr__->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00144780;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Lhs>() const {
    return MakeMatcher(new Impl<Lhs>(rhs_));
  }